

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall
bloaty::RangeMapTest_Translation2_Test::TestBody(RangeMapTest_Translation2_Test *this)

{
  RangeMap *this_00;
  RangeMap *this_01;
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  char *expected_predicate_value;
  long *plVar4;
  long *plVar5;
  long lVar6;
  pointer *__ptr;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  undefined1 local_138 [8];
  pointer local_130;
  AssertHelper local_120;
  undefined1 local_118 [24];
  string local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 local_d8;
  uint64_t local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  undefined8 local_a8;
  undefined8 local_a0;
  uint64_t local_98;
  long *local_90 [2];
  long local_80 [2];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  long *local_58 [2];
  long local_48 [2];
  RangeMap *local_38;
  
  pcVar1 = local_118 + 0x10;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,5,5,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"bar","");
  RangeMap::AddDualRange(this_00,0x14,5,0x78,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"baz","");
  RangeMap::AddRange(this_00,0x19,5,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"quux","");
  RangeMap::AddDualRange(this_00,0x1e,5,0x82,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_118._0_8_ = (pointer)0x5;
  local_118._8_8_ = 10;
  local_118._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_100._0_8_ = local_f0;
  std::__cxx11::string::_M_construct<char_const*>(local_100,"foo","");
  local_e0 = 0x14;
  local_d8 = 0x19;
  local_d0 = 0x78;
  plVar3 = local_b8;
  local_c8[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"bar","");
  local_a8 = 0x19;
  local_a0 = 0x1e;
  local_98 = (this->super_RangeMapTest).kNoTranslation;
  plVar5 = local_80;
  local_90[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"baz","");
  local_70 = 0x1e;
  local_68 = 0x23;
  local_60 = 0x82;
  plVar4 = local_48;
  local_58[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"quux","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_118;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_138,__l,(allocator_type *)&local_140);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,this_00,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_138);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_138);
  lVar6 = -0xe0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -7;
    lVar6 = lVar6 + 0x38;
  } while (lVar6 != 0);
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"translate me","");
  this_01 = &(this->super_RangeMapTest).map2_;
  local_38 = &(this->super_RangeMapTest).map3_;
  expected_predicate_value = (char *)0x0;
  local_138[0] = (internal)
                 RangeMap::AddRangeWithTranslation
                           (this_01,0x14,0xf,(string *)local_118,this_00,false,local_38);
  local_130 = (pointer)0x0;
  if ((undefined1 *)local_118._0_8_ == local_118 + 0x10) {
    bVar2 = true;
    if ((bool)local_138[0]) goto LAB_0017cd69;
  }
  else {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    bVar2 = true;
    if (((byte)local_138[0] & 1) != 0) goto LAB_0017cd69;
  }
  testing::Message::Message((Message *)&local_140);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_118,(internal *)local_138,
             (AssertionResult *)
             "map2_.AddRangeWithTranslation(20, 15, \"translate me\", map_, false, &map3_)","false",
             "true",expected_predicate_value);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
             ,0x16e,(char *)local_118._0_8_);
  testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_140);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_140._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_140._M_head_impl + 8))();
  }
  bVar2 = false;
LAB_0017cd69:
  if (local_130 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
  }
  if (bVar2) {
    RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
    local_118._0_8_ = (pointer)0x14;
    local_118._8_8_ = 0x19;
    local_118._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>(local_100,"translate me","");
    local_e0 = 0x19;
    local_d8 = 0x1e;
    local_d0 = (this->super_RangeMapTest).kNoTranslation;
    local_c8[0] = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"translate me","");
    local_a8 = 0x1e;
    local_a0 = 0x23;
    local_98 = (this->super_RangeMapTest).kNoTranslation;
    local_90[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"translate me","");
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_118;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138,__l_00,(allocator_type *)&local_140);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,this_01,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138);
    lVar6 = -0xa8;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -7;
      lVar6 = lVar6 + 0x38;
    } while (lVar6 != 0);
    local_118._0_8_ = (pointer)0x78;
    local_118._8_8_ = 0x7d;
    local_118._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>(local_100,"translate me","");
    local_e0 = 0x82;
    local_d8 = 0x87;
    local_d0 = (this->super_RangeMapTest).kNoTranslation;
    local_c8[0] = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"translate me","");
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_118;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138,__l_01,(allocator_type *)&local_140);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,local_38,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_138);
    lVar6 = -0x70;
    do {
      if (plVar3 != (long *)plVar3[-2]) {
        operator_delete((long *)plVar3[-2],*plVar3 + 1);
      }
      plVar3 = plVar3 + -7;
      lVar6 = lVar6 + 0x38;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation2) {
  map_.AddRange(5, 5, "foo");
  map_.AddDualRange(20, 5, 120, "bar");
  map_.AddRange(25, 5, "baz");
  map_.AddDualRange(30, 5, 130, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 10, kNoTranslation, "foo"},
    {20, 25, 120, "bar"},
    {25, 30, kNoTranslation, "baz"},
    {30, 35, 130, "quux"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 15, "translate me", map_, false,
                                            &map3_));
  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {25, 30, kNoTranslation, "translate me"},
    {30, 35, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {130, 135, kNoTranslation, "translate me"}
  });
}